

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashmk::Hash32Len13to24(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong in_RSI;
  char *in_RDI;
  uint32_t h;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  
  util::Fetch32(in_RDI + ((in_RSI >> 1) - 4));
  util::Fetch32(in_RDI + 4);
  util::Fetch32(in_RDI + (in_RSI - 8));
  uVar1 = util::Fetch32(in_RDI + (in_RSI >> 1));
  util::Fetch32(in_RDI);
  util::Fetch32(in_RDI + (in_RSI - 4));
  util::Rotate32(0,0x2089ee);
  util::Mur(0,0x208a03);
  util::Rotate32(0,0x208a19);
  util::Mur(0,0x208a2e);
  uVar2 = util::Rotate32(0,0x208a48);
  uVar3 = util::Mur(0,0x208a61);
  uVar1 = util::fmix(uVar3 + uVar2 + uVar1);
  return uVar1;
}

Assistant:

STATIC_INLINE uint32_t Hash32Len13to24(const char *s, size_t len, uint32_t seed = 0) {
  uint32_t a = Fetch(s - 4 + (len >> 1));
  uint32_t b = Fetch(s + 4);
  uint32_t c = Fetch(s + len - 8);
  uint32_t d = Fetch(s + (len >> 1));
  uint32_t e = Fetch(s);
  uint32_t f = Fetch(s + len - 4);
  uint32_t h = d * c1 + len + seed;
  a = Rotate(a, 12) + f;
  h = Mur(c, h) + a;
  a = Rotate(a, 3) + c;
  h = Mur(e, h) + a;
  a = Rotate(a + f, 12) + d;
  h = Mur(b ^ seed, h) + a;
  return fmix(h);
}